

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall ddd::DaTrie<true,_true,_false>::push_block_(DaTrie<true,_true,_false> *this)

{
  uint block_pos_00;
  vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *in_RDI;
  uint32_t i_2;
  uint32_t end;
  uint32_t begin;
  uint32_t i_1;
  uint32_t i;
  uint32_t block_pos;
  value_type *in_stack_ffffffffffffff98;
  value_type *__x;
  DaTrie<true,_true,_false> *in_stack_ffffffffffffffa0;
  uint local_48;
  uint uVar1;
  uint32_t in_stack_ffffffffffffffc4;
  NodeLink local_2a;
  uint local_28;
  Bc local_18;
  uint local_10;
  uint32_t local_c;
  
  local_c = num_blocks((DaTrie<true,_true,_false> *)0x175f98);
  for (local_10 = 0; local_10 < 0x100; local_10 = local_10 + 1) {
    Bc::Bc(&local_18);
    std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::push_back
              (&in_stack_ffffffffffffffa0->bc_,in_stack_ffffffffffffff98);
    Bc::~Bc(&local_18);
  }
  for (local_28 = 0; local_28 < 0x100; local_28 = local_28 + 1) {
    in_stack_ffffffffffffffa0 = (DaTrie<true,_true,_false> *)(in_RDI + 3);
    memset(&local_2a,0,2);
    NodeLink::NodeLink(&local_2a);
    std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::push_back
              ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)in_stack_ffffffffffffffa0,
               (value_type *)in_stack_ffffffffffffff98);
  }
  __x = (value_type *)(in_RDI + 2);
  memset(&stack0xffffffffffffffc4,0,0x10);
  BlockLink::BlockLink((BlockLink *)&stack0xffffffffffffffc4);
  std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::push_back
            ((vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)in_stack_ffffffffffffffa0,
             __x);
  local_48 = local_c * 0x100;
  block_pos_00 = local_48 + 0x100;
  uVar1 = local_48;
  for (; local_48 < block_pos_00; local_48 = local_48 + 1) {
    set_next_(in_stack_ffffffffffffffa0,(uint32_t)((ulong)__x >> 0x20),(uint32_t)__x);
    set_prev_(in_stack_ffffffffffffffa0,(uint32_t)((ulong)__x >> 0x20),(uint32_t)__x);
  }
  push_block_((DaTrie<true,_true,_false> *)CONCAT44(in_stack_ffffffffffffffc4,uVar1),block_pos_00,
              in_RDI);
  *(int *)((long)&in_RDI[4].super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>.
                  _M_impl.super__Vector_impl_data._M_start + 4) =
       *(int *)((long)&in_RDI[4].super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>
                       ._M_impl.super__Vector_impl_data._M_start + 4) + 0x100;
  return;
}

Assistant:

void push_block_() {
    auto block_pos = num_blocks();

    for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
      bc_.push_back(Bc{});
    }
    if (WithNLM) {
      for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
        node_links_.push_back(NodeLink{});
      }
    }
    blocks_.push_back(BlockType{});

    auto begin = block_pos * BLOCK_SIZE;
    auto end = begin + BLOCK_SIZE;

    for (auto i = begin; i < end; ++i) {
      set_next_(i, i + 1);
      set_prev_(i, i - 1);
    }

    push_block_(block_pos, blocks_);
    bc_emps_ += BLOCK_SIZE;
  }